

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_set_from_euler_anglesf3_EXP(matrix4 *self,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double BD;
  double AD;
  double F;
  double E;
  double D;
  double C;
  double B;
  double A;
  double z_local;
  double y_local;
  double x_local;
  matrix4 *self_local;
  
  dVar1 = cos(x);
  dVar2 = sin(x);
  dVar3 = cos(y);
  dVar4 = sin(y);
  dVar5 = cos(z);
  dVar6 = sin(z);
  (self->field_0).m[0] = dVar3 * dVar5;
  (self->field_0).m[4] = -dVar3 * dVar6;
  (self->field_0).m[8] = dVar4;
  (self->field_0).m[0xc] = 0.0;
  (self->field_0).m[1] = dVar2 * dVar4 * dVar5 + dVar1 * dVar6;
  (self->field_0).m[5] = -(dVar2 * dVar4) * dVar6 + dVar1 * dVar5;
  (self->field_0).m[9] = -dVar2 * dVar3;
  (self->field_0).m[0xd] = 0.0;
  (self->field_0).m[2] = -(dVar1 * dVar4) * dVar5 + dVar2 * dVar6;
  (self->field_0).m[6] = dVar1 * dVar4 * dVar6 + dVar2 * dVar5;
  (self->field_0).m[10] = dVar1 * dVar3;
  (self->field_0).m[0xe] = 0.0;
  (self->field_0).m[3] = 0.0;
  (self->field_0).m[7] = 0.0;
  (self->field_0).m[0xb] = 0.0;
  (self->field_0).m[0xf] = 1.0;
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_set_from_euler_anglesf3_EXP(struct matrix4 *self, const HYP_FLOAT x, const HYP_FLOAT y, const HYP_FLOAT z)
{
	HYP_FLOAT A = HYP_COS(x);
	HYP_FLOAT B = HYP_SIN(x);
	HYP_FLOAT C = HYP_COS(y);
	HYP_FLOAT D = HYP_SIN(y);
	HYP_FLOAT E = HYP_COS(z);
	HYP_FLOAT F = HYP_SIN(z);

	HYP_FLOAT AD = A * D;
	HYP_FLOAT BD = B * D;

	self->c00 = C * E;
	self->c01 = -C * F;
	self->c02 = D;
	self->c03 = 0.0f;

	self->c10 = BD * E + A * F;
	self->c11 = -BD * F + A * E;
	self->c12 = -B * C;
	self->c13 = 0.0f;

	self->c20 = -AD * E + B * F;
	self->c21 = AD * F + B * E;
	self->c22 = A * C;
	self->c23 = 0.0f;

	self->c30 = 0.0f;
	self->c31 = 0.0f;
	self->c32 = 0.0f;
	self->c33 = 1.0f;

	return self;
}